

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *
testing::internal::
MatcherCastImpl<const_std::pair<int,_phmap::priv::NonStandardLayout>_&,_std::pair<const_int,_phmap::priv::NonStandardLayout>_>
::CastImpl(Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *__return_storage_ptr__,
          int *value)

{
  undefined1 local_48 [16];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_48._0_4_ = *value;
  local_48._8_8_ = &PTR__NonStandardLayout_00345320;
  local_38._M_p = (pointer)&local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,*(long *)(value + 4),*(long *)(value + 6) + *(long *)(value + 4));
  Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::Matcher
            (__return_storage_ptr__,(pair<int,_phmap::priv::NonStandardLayout> *)local_48);
  local_48._8_8_ = &PTR__NonStandardLayout_00345320;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_p != &local_28) {
    operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& value,
                             std::false_type /* convertible_to_matcher */,
                             std::true_type /* convertible_to_T */) {
    return Matcher<T>(ImplicitCast_<T>(value));
  }